

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5PrepareStatement(sqlite3_stmt **ppStmt,Fts5Config *pConfig,char *zFmt,...)

{
  char in_AL;
  char *zSql_00;
  char *pcVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [24];
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined1 local_58 [8];
  va_list ap;
  char *zSql;
  sqlite3 *psStack_28;
  int rc;
  sqlite3_stmt *pRet;
  char *zFmt_local;
  Fts5Config *pConfig_local;
  sqlite3_stmt **ppStmt_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  psStack_28 = (sqlite3 *)0x0;
  ap[0].overflow_arg_area = local_108;
  ap[0]._0_8_ = &stack0x00000008;
  local_58._4_4_ = 0x30;
  local_58._0_4_ = 0x18;
  local_f0 = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  pRet = (sqlite3_stmt *)zFmt;
  zFmt_local = (char *)pConfig;
  pConfig_local = (Fts5Config *)ppStmt;
  zSql_00 = sqlite3_vmprintf(zFmt,(__va_list_tag *)local_58);
  if (zSql_00 == (char *)0x0) {
    zSql._4_4_ = 7;
  }
  else {
    zSql._4_4_ = sqlite3_prepare_v3(*(sqlite3 **)zFmt_local,zSql_00,-1,1,
                                    (sqlite3_stmt **)&stack0xffffffffffffffd8,(char **)0x0);
    if (zSql._4_4_ != 0) {
      pcVar1 = sqlite3_errmsg(*(sqlite3 **)zFmt_local);
      pcVar1 = sqlite3_mprintf("%s",pcVar1);
      **(undefined8 **)(zFmt_local + 0xa0) = pcVar1;
    }
    sqlite3_free(zSql_00);
  }
  pConfig_local->db = psStack_28;
  return zSql._4_4_;
}

Assistant:

static int fts5PrepareStatement(
  sqlite3_stmt **ppStmt,
  Fts5Config *pConfig, 
  const char *zFmt,
  ...
){
  sqlite3_stmt *pRet = 0;
  int rc;
  char *zSql;
  va_list ap;

  va_start(ap, zFmt);
  zSql = sqlite3_vmprintf(zFmt, ap);
  if( zSql==0 ){
    rc = SQLITE_NOMEM; 
  }else{
    rc = sqlite3_prepare_v3(pConfig->db, zSql, -1, 
                            SQLITE_PREPARE_PERSISTENT, &pRet, 0);
    if( rc!=SQLITE_OK ){
      *pConfig->pzErrmsg = sqlite3_mprintf("%s", sqlite3_errmsg(pConfig->db));
    }
    sqlite3_free(zSql);
  }

  va_end(ap);
  *ppStmt = pRet;
  return rc;
}